

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeError(ExpressionContext *ctx,SynError *syntax)

{
  int iVar1;
  undefined4 extraout_var;
  TypeBase *type;
  
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
  type = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  ExprError::ExprError((ExprError *)CONCAT44(extraout_var,iVar1),&syntax->super_SynBase,type);
  return &((ExprError *)CONCAT44(extraout_var,iVar1))->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeError(ExpressionContext &ctx, SynError *syntax)
{
	return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType());
}